

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.h
# Opt level: O2

void __thiscall
dlib::add_prev_<dlib::tag1>::
forward<dlib::dimpl::subnet_wrapper<dlib::add_layer<dlib::affine_,dlib::add_layer<dlib::con_<2048l,1l,1l,1,1,0,0>,dlib::add_layer<dlib::relu_,dlib::add_layer<dlib::affine_,dlib::add_layer<dlib::con_<512l,3l,3l,1,1,1,1>,dlib::add_layer<dlib::relu_,dlib::add_layer<dlib::affine_,dlib::add_layer<dlib::con_<512l,1l,1l,1,1,0,0>,dlib::add_tag_layer<1ul,dlib::impl::repeat_input_layer,void>,void>,void>,void>,void>,void>,void>,void>,void>,true,void>>
          (add_prev_<dlib::tag1> *this,
          subnet_wrapper<dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<2048L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<512L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_true,_void>
          *sub,resizable_tensor *output)

{
  add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void> *paVar1;
  tensor *ptVar2;
  _Head_base<0UL,_dlib::add_layer<dlib::con_<2048L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<512L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_*,_false>
  _Var3;
  long lVar4;
  long lVar5;
  long lVar6;
  long n_;
  long lVar7;
  tensor *src2;
  
  paVar1 = ((subnet_wrapper<dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_false,_void>
             *)((long)&(sub->subnetwork).subnetwork.subnetwork.subnetwork.subnetwork.subnetwork.
                       subnetwork + 8))->l;
  ptVar2 = paVar1->cached_output_ptr;
  _Var3._M_head_impl =
       (sub->l->subnetwork)._M_t.
       super___uniq_ptr_impl<dlib::add_layer<dlib::con_<2048L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<512L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_std::default_delete<dlib::add_layer<dlib::con_<2048L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<512L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_dlib::add_layer<dlib::con_<2048L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<512L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_*,_std::default_delete<dlib::add_layer<dlib::con_<2048L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<512L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_>_>
       .
       super__Head_base<0UL,_dlib::add_layer<dlib::con_<2048L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<512L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>_*,_false>
       ._M_head_impl;
  lVar5 = *(longlong *)((long)&(_Var3._M_head_impl)->cached_output + 0x10);
  lVar7 = *(longlong *)((long)&(_Var3._M_head_impl)->cached_output + 0x18);
  src2 = &(paVar1->cached_output).super_tensor;
  if (ptVar2 != (tensor *)0x0) {
    src2 = ptVar2;
  }
  lVar6 = *(longlong *)((long)&(_Var3._M_head_impl)->cached_output + 8);
  lVar4 = *(longlong *)((long)&(_Var3._M_head_impl)->cached_output + 0x20);
  n_ = src2->m_n;
  if (src2->m_n < lVar6) {
    n_ = lVar6;
  }
  lVar6 = src2->m_k;
  if (src2->m_k < lVar5) {
    lVar6 = lVar5;
  }
  lVar5 = src2->m_nr;
  if (src2->m_nr < lVar7) {
    lVar5 = lVar7;
  }
  lVar7 = src2->m_nc;
  if (src2->m_nc < lVar4) {
    lVar7 = lVar4;
  }
  resizable_tensor::set_size(output,n_,lVar6,lVar5,lVar7);
  tt::add(&output->super_tensor,&((_Var3._M_head_impl)->cached_output).super_tensor,src2);
  return;
}

Assistant:

void forward(const SUBNET& sub, resizable_tensor& output)
        {
            auto&& t1 = sub.get_output();
            auto&& t2 = layer<tag>(sub).get_output();
            output.set_size(std::max(t1.num_samples(),t2.num_samples()),
                            std::max(t1.k(),t2.k()),
                            std::max(t1.nr(),t2.nr()),
                            std::max(t1.nc(),t2.nc()));
            tt::add(output, t1, t2);
        }